

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O0

MakeNet * __thiscall notch::core::MakeNet::addActivation(MakeNet *this,Activation *af)

{
  value_type local_60 [4];
  undefined1 local_50 [8];
  MakeLayer mk;
  Activation *af_local;
  MakeNet *this_local;
  
  mk.maybeActivation = af;
  checkConfig(this);
  MakeLayer::MakeLayer((MakeLayer *)local_50,this->nOutputs,mk.maybeActivation);
  std::vector<notch::core::MakeLayer,_std::allocator<notch::core::MakeLayer>_>::push_back
            (&this->layerMakers,(MakeLayer *)local_50);
  local_60[0] = FC;
  std::vector<notch::core::MakeNet::LayerType,_std::allocator<notch::core::MakeNet::LayerType>_>::
  push_back(&this->layerTypes,local_60);
  MakeLayer::~MakeLayer((MakeLayer *)local_50);
  return this;
}

Assistant:

MakeNet &addActivation(const Activation &af) {
        checkConfig();
        MakeLayer mk(nOutputs, af);
        layerMakers.push_back(mk);
        layerTypes.push_back(LayerType::FC);
        return *this;
    }